

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O1

IString __thiscall wasm::Wasm2JSBuilder::getTemp(Wasm2JSBuilder *this,Type type,Function *func)

{
  key_type *__k;
  pointer *ppIVar1;
  long *plVar2;
  unordered_map<wasm::Type,_std::vector<wasm::IString,_std::allocator<wasm::IString>_>,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::IString,_std::allocator<wasm::IString>_>_>_>_>
  *this_00;
  uint __val;
  bool bVar3;
  char cVar4;
  char cVar5;
  mapped_type *pmVar6;
  mapped_type *pmVar7;
  undefined8 *puVar8;
  long *plVar9;
  size_t sVar10;
  __node_base_ptr p_Var11;
  ulong *puVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  Type in_R8;
  __hash_code __code;
  char *__code_00;
  Name NVar16;
  string_view sVar17;
  ulong *local_f8;
  long local_f0;
  ulong local_e8 [2];
  ulong *local_d8;
  uintptr_t local_d0;
  ulong local_c8;
  long lStack_c0;
  ulong *local_b8;
  long local_b0;
  ulong local_a8 [2];
  long *local_98;
  undefined8 local_90;
  long local_88;
  undefined8 uStack_80;
  string_view local_78;
  long local_68;
  undefined8 uStack_60;
  size_type *local_58;
  string __str;
  Type type_local;
  
  __str.field_2._8_8_ = type.id;
  if ((type.id & 1) != 0 && 6 < type.id) {
    __assert_fail("!type.isTuple() && \"Unexpected tuple type\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm2js.h"
                  ,0xd3,"IString wasm::Wasm2JSBuilder::getTemp(Type, Function *)");
  }
  this_00 = &this->frees;
  pmVar6 = std::__detail::
           _Map_base<wasm::Type,_std::pair<const_wasm::Type,_std::vector<wasm::IString,_std::allocator<wasm::IString>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::IString,_std::allocator<wasm::IString>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<wasm::Type,_std::pair<const_wasm::Type,_std::vector<wasm::IString,_std::allocator<wasm::IString>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::IString,_std::allocator<wasm::IString>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this_00,(key_type *)((long)&__str.field_2 + 8));
  if ((pmVar6->super__Vector_base<wasm::IString,_std::allocator<wasm::IString>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (pmVar6->super__Vector_base<wasm::IString,_std::allocator<wasm::IString>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    __k = (key_type *)((long)&__str.field_2 + 8);
    pmVar6 = std::__detail::
             _Map_base<wasm::Type,_std::pair<const_wasm::Type,_std::vector<wasm::IString,_std::allocator<wasm::IString>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::IString,_std::allocator<wasm::IString>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<wasm::Type,_std::pair<const_wasm::Type,_std::vector<wasm::IString,_std::allocator<wasm::IString>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::IString,_std::allocator<wasm::IString>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)this_00,__k);
    sVar17 = (pmVar6->super__Vector_base<wasm::IString,_std::allocator<wasm::IString>_>)._M_impl.
             super__Vector_impl_data._M_finish[-1].str;
    pmVar6 = std::__detail::
             _Map_base<wasm::Type,_std::pair<const_wasm::Type,_std::vector<wasm::IString,_std::allocator<wasm::IString>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::IString,_std::allocator<wasm::IString>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<wasm::Type,_std::pair<const_wasm::Type,_std::vector<wasm::IString,_std::allocator<wasm::IString>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::IString,_std::allocator<wasm::IString>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)this_00,__k);
    ppIVar1 = &(pmVar6->super__Vector_base<wasm::IString,_std::allocator<wasm::IString>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    *ppIVar1 = *ppIVar1 + -1;
    goto LAB_001624f2;
  }
  pmVar7 = std::__detail::
           _Map_base<wasm::Type,_std::pair<const_wasm::Type,_unsigned_int>,_std::allocator<std::pair<const_wasm::Type,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<wasm::Type,_std::pair<const_wasm::Type,_unsigned_int>,_std::allocator<std::pair<const_wasm::Type,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&this->temps,(key_type *)((long)&__str.field_2 + 8));
  __val = *pmVar7;
  *pmVar7 = __val + 1;
  local_b8 = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"wasm2js_","");
  ::wasm::Type::toString_abi_cxx11_();
  uVar14 = 0xf;
  if (local_b8 != local_a8) {
    uVar14 = local_a8[0];
  }
  if (uVar14 < (ulong)(local_f0 + local_b0)) {
    uVar14 = 0xf;
    if (local_f8 != local_e8) {
      uVar14 = local_e8[0];
    }
    if (uVar14 < (ulong)(local_f0 + local_b0)) goto LAB_00162229;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_f8,0,(char *)0x0,(ulong)local_b8);
  }
  else {
LAB_00162229:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_f8);
  }
  local_98 = &local_88;
  plVar9 = puVar8 + 2;
  if ((long *)*puVar8 == plVar9) {
    local_88 = *plVar9;
    uStack_80 = puVar8[3];
  }
  else {
    local_88 = *plVar9;
    local_98 = (long *)*puVar8;
  }
  local_90 = puVar8[1];
  *puVar8 = plVar9;
  puVar8[1] = 0;
  *(undefined1 *)plVar9 = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_98);
  puVar12 = (ulong *)(plVar9 + 2);
  if ((ulong *)*plVar9 == puVar12) {
    local_c8 = *puVar12;
    lStack_c0 = plVar9[3];
    local_d8 = &local_c8;
  }
  else {
    local_c8 = *puVar12;
    local_d8 = (ulong *)*plVar9;
  }
  local_d0 = plVar9[1];
  *plVar9 = (long)puVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  cVar5 = '\x01';
  if (9 < __val) {
    uVar13 = __val;
    cVar4 = '\x04';
    do {
      cVar5 = cVar4;
      if (uVar13 < 100) {
        cVar5 = cVar5 + -2;
        goto LAB_00162349;
      }
      if (uVar13 < 1000) {
        cVar5 = cVar5 + -1;
        goto LAB_00162349;
      }
      if (uVar13 < 10000) goto LAB_00162349;
      bVar3 = 99999 < uVar13;
      uVar13 = uVar13 / 10000;
      cVar4 = cVar5 + '\x04';
    } while (bVar3);
    cVar5 = cVar5 + '\x01';
  }
LAB_00162349:
  local_58 = &__str._M_string_length;
  std::__cxx11::string::_M_construct((ulong)&local_58,cVar5);
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)local_58,(uint)__str._M_dataplus._M_p,__val);
  uVar14 = CONCAT44(__str._M_dataplus._M_p._4_4_,(uint)__str._M_dataplus._M_p) + local_d0;
  uVar15 = 0xf;
  if (local_d8 != &local_c8) {
    uVar15 = local_c8;
  }
  in_R8.id = local_d0;
  if (uVar15 < uVar14) {
    uVar15 = 0xf;
    if (local_58 != &__str._M_string_length) {
      uVar15 = __str._M_string_length;
    }
    if (uVar15 < uVar14) goto LAB_001623b1;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,(ulong)local_d8);
  }
  else {
LAB_001623b1:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_58);
  }
  plVar9 = &local_68;
  plVar2 = puVar8 + 2;
  if ((long *)*puVar8 == plVar2) {
    local_68 = *plVar2;
    uStack_60 = puVar8[3];
  }
  else {
    local_68 = *plVar2;
    plVar9 = (long *)*puVar8;
  }
  local_78._M_str = (char *)puVar8[1];
  local_78._M_len = (size_t)plVar9;
  *puVar8 = plVar2;
  puVar8[1] = 0;
  *(char *)plVar2 = '\0';
  sVar10 = strlen((char *)plVar9);
  NVar16.super_IString.str = (IString)::wasm::IString::interned(sVar10,plVar9,0);
  if ((long *)local_78._M_len != &local_68) {
    operator_delete((void *)local_78._M_len,local_68 + 1);
  }
  if (local_58 != &__str._M_string_length) {
    operator_delete(local_58,__str._M_string_length + 1);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8,local_c8 + 1);
  }
  if (local_98 != &local_88) {
    operator_delete(local_98,local_88 + 1);
  }
  if (local_f8 != local_e8) {
    operator_delete(local_f8,local_e8[0] + 1);
  }
  if (local_b8 != local_a8) {
    operator_delete(local_b8,local_a8[0] + 1);
  }
  sVar17 = (string_view)fromName(this,NVar16,Local);
LAB_001624f2:
  __code_00 = sVar17._M_str;
  local_78 = sVar17;
  p_Var11 = std::
            _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::_M_find_before_node
                      (&(func->localIndices)._M_h,
                       (ulong)__code_00 % (func->localIndices)._M_h._M_bucket_count,
                       (key_type *)&local_78,(__hash_code)__code_00);
  if ((p_Var11 == (__node_base_ptr)0x0) || (p_Var11->_M_nxt == (_Hash_node_base *)0x0)) {
    NVar16.super_IString.str._M_str = (char *)__str.field_2._8_8_;
    NVar16.super_IString.str._M_len = (size_t)__code_00;
    Builder::addVar((Builder *)func,(Function *)sVar17._M_len,NVar16,in_R8);
  }
  return (IString)sVar17;
}

Assistant:

IString getTemp(Type type, Function* func) {
    IString ret;
    // TODO: handle tuples
    assert(!type.isTuple() && "Unexpected tuple type");
    if (frees[type].size() > 0) {
      ret = frees[type].back();
      frees[type].pop_back();
    } else {
      auto index = temps[type]++;
      ret = IString((std::string("wasm2js_") + type.toString() + "$" +
                     std::to_string(index))
                      .c_str(),
                    false);
      ret = fromName(ret, NameScope::Local);
    }
    if (func->localIndices.find(ret) == func->localIndices.end()) {
      Builder::addVar(func, ret, type);
    }
    return ret;
  }